

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::Resize
          (KeyMapBase<unsigned_int> *this,map_index_t new_num_buckets)

{
  uint n;
  NodeBase *pNVar1;
  map_index_t b;
  char *failure_msg;
  NodeBase **ppNVar2;
  NodeBase **ppNVar3;
  int line;
  map_index_t i;
  map_index_t mVar4;
  NodeBase *node;
  uint local_44;
  LogMessageFatal local_40;
  
  local_44 = 2;
  local_40.super_LogMessage.errno_saver_.saved_errno_ = new_num_buckets;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_40,&local_44,"new_num_buckets >= kMinTableSize");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (new_num_buckets - 1 < (new_num_buckets ^ new_num_buckets - 1)) {
      if ((this->super_UntypedMapBase).num_buckets_ == 1) {
        (this->super_UntypedMapBase).index_of_first_non_null_ = new_num_buckets;
        (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
        ppNVar2 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
        (this->super_UntypedMapBase).table_ = ppNVar2;
      }
      else {
        local_44 = 2;
        local_40.super_LogMessage.errno_saver_.saved_errno_ = new_num_buckets;
        failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_int,unsigned_int>
                                ((uint *)&local_40,&local_44,"new_num_buckets >= kMinTableSize");
        if (failure_msg != (Nullable<const_char_*>)0x0) {
          line = 0x392;
          goto LAB_005b8852;
        }
        ppNVar2 = (this->super_UntypedMapBase).table_;
        n = (this->super_UntypedMapBase).num_buckets_;
        (this->super_UntypedMapBase).num_buckets_ = new_num_buckets;
        ppNVar3 = UntypedMapBase::CreateEmptyTable(&this->super_UntypedMapBase,new_num_buckets);
        (this->super_UntypedMapBase).table_ = ppNVar3;
        mVar4 = (this->super_UntypedMapBase).index_of_first_non_null_;
        (this->super_UntypedMapBase).index_of_first_non_null_ =
             (this->super_UntypedMapBase).num_buckets_;
        for (; mVar4 < n; mVar4 = mVar4 + 1) {
          node = ppNVar2[mVar4];
          while (node != (NodeBase *)0x0) {
            pNVar1 = node->next;
            b = BucketNumber(this,*(ViewType *)&node[1].next);
            InsertUnique(this,b,(KeyNode *)node);
            node = pNVar1;
          }
        }
        UntypedMapBase::DeleteTable(&this->super_UntypedMapBase,ppNVar2,n);
        AssertLoadFactor(this);
      }
      return;
    }
    failure_msg = "absl::has_single_bit(new_num_buckets)";
    line = 0x389;
  }
  else {
    line = 0x388;
  }
LAB_005b8852:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void Resize(map_index_t new_num_buckets) {
    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    ABSL_DCHECK(absl::has_single_bit(new_num_buckets));
    if (num_buckets_ == kGlobalEmptyTableSize) {
      // This is the global empty array.
      // Just overwrite with a new one. No need to transfer or free anything.
      num_buckets_ = index_of_first_non_null_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      return;
    }

    ABSL_DCHECK_GE(new_num_buckets, kMinTableSize);
    const auto old_table = table_;
    const map_index_t old_table_size = num_buckets_;
    num_buckets_ = new_num_buckets;
    table_ = CreateEmptyTable(num_buckets_);
    const map_index_t start = index_of_first_non_null_;
    index_of_first_non_null_ = num_buckets_;
    for (map_index_t i = start; i < old_table_size; ++i) {
      for (KeyNode* node = static_cast<KeyNode*>(old_table[i]);
           node != nullptr;) {
        auto* next = static_cast<KeyNode*>(node->next);
        InsertUnique(BucketNumber(TS::ToView(node->key())), node);
        node = next;
      }
    }
    DeleteTable(old_table, old_table_size);
    AssertLoadFactor();
  }